

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall Liby::Socket::listen(Socket *this,int __fd,int __n)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  int reuse;
  sockaddr_in address;
  undefined4 local_24;
  sockaddr local_20;
  
  if ((this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    createSocket(this);
  }
  FileDescriptor::set_noblock
            ((this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,true);
  local_24 = 1;
  iVar1 = setsockopt(this->fd_,1,2,&local_24,4);
  if (-1 < iVar1) {
    local_20.sa_family = 2;
    local_20.sa_data._2_4_ = (this->ep_).addr_;
    local_20.sa_data._0_2_ = (this->ep_).port_;
    iVar1 = bind(this->fd_,&local_20,0x10);
    if (-1 < iVar1) {
      if (this->isUdp_ == false) {
        iVar1 = ::listen(this->fd_,0x14);
        if (iVar1 < 0) goto LAB_001076dd;
      }
      return iVar1;
    }
  }
LAB_001076dd:
  piVar2 = __errno_location();
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar4 = strerror(*piVar2);
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char*::typeinfo,0);
}

Assistant:

void Socket::listen() {
    if (!fp_) {
        createSocket();
    }

    setNoblock();

    int reuse = 1;
    if (::setsockopt(fd_, SOL_SOCKET, SO_REUSEADDR, &reuse, sizeof(int)) < 0) {
        throw_err();
    }

    struct sockaddr_in address;
    address.sin_family = AF_INET;
    //    address.sin_len = sizeof(address);
    struct in_addr in_addr1;
    in_addr1.s_addr = ep_.addr_;
    address.sin_addr = in_addr1;
    address.sin_port = ep_.port_;

    if (::bind(fd_, (struct sockaddr *)&address, sizeof(address)) < 0) {
        throw_err();
    }
    if (isUdp_ == false && ::listen(fd_, 20) < 0) {
        throw_err();
    }
}